

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_transport.c
# Opt level: O0

int find_transport_in_cm(CManager cm,char *trans_name)

{
  int iVar1;
  char *in_RSI;
  long *in_RDI;
  int i;
  int local_1c;
  
  local_1c = 0;
  if (*in_RDI != 0) {
    while (*(long *)(*in_RDI + (long)local_1c * 8) != 0) {
      iVar1 = strcmp((char *)**(undefined8 **)(*in_RDI + (long)local_1c * 8),in_RSI);
      if (iVar1 == 0) {
        return 1;
      }
      local_1c = local_1c + 1;
    }
  }
  return 0;
}

Assistant:

int
find_transport_in_cm(CManager cm, const char *trans_name)
{
    int i = 0;
    if (cm->transports == NULL)
	return 0;
    while (cm->transports[i] != NULL) {
	if (strcmp(cm->transports[i]->trans_name, trans_name) == 0)
	    return 1;
	i++;
    }
    return 0;
}